

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool __thiscall
QArrayDataPointer<char>::tryReadjustFreeSpace
          (QArrayDataPointer<char> *this,GrowthPosition pos,qsizetype n,char **data)

{
  Data *pDVar1;
  P _b;
  long lVar2;
  long lVar3;
  qsizetype qVar4;
  ulong uVar5;
  long lVar6;
  
  pDVar1 = this->d;
  if (pDVar1 == (Data *)0x0) {
    qVar4 = 0;
  }
  else {
    qVar4 = (pDVar1->super_QArrayData).alloc;
  }
  uVar5 = (ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0;
  lVar3 = (long)this->ptr - uVar5;
  if (pDVar1 == (Data *)0x0) {
    lVar6 = 0;
    lVar3 = 0;
  }
  else {
    lVar6 = (uVar5 + (pDVar1->super_QArrayData).alloc) - (long)(this->ptr + this->size);
  }
  if (((pos == GrowsAtEnd) && (n <= lVar3)) &&
     (lVar2 = this->size * 3, SBORROW8(lVar2,qVar4 * 2) != lVar2 + qVar4 * -2 < 0)) {
    lVar6 = 0;
  }
  else {
    if (pos != GrowsAtBeginning) {
      return false;
    }
    if (lVar6 < n) {
      return false;
    }
    if (qVar4 <= this->size * 3) {
      return false;
    }
    lVar2 = (qVar4 - (this->size + n)) / 2;
    lVar6 = 0;
    if (0 < lVar2) {
      lVar6 = lVar2;
    }
    lVar6 = lVar6 + n;
  }
  relocate(this,lVar6 - lVar3,data);
  return true;
}

Assistant:

qsizetype constAllocatedCapacity() const noexcept { return d ? d->constAllocatedCapacity() : 0; }